

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O1

bool __thiscall Clasp::SatElite::addResolvent(SatElite *this,uint32 id,Clause *lhs,Clause *rhs)

{
  undefined1 *puVar1;
  uint32 size;
  Solver *this_00;
  pointer pLVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  Clause *pCVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  Literal l;
  Literal local_5c;
  LitVec *local_58;
  uint32 local_4c;
  Clause *local_48;
  ulong local_40;
  Antecedent local_38;
  
  local_58 = &this->resolvent_;
  (this->resolvent_).ebo_.size = 0;
  this_00 = *(((this->super_SatPreprocessor).ctx_)->solvers_).ebo_.buf;
  local_5c.rep_ = 0;
  uVar9 = *(uint *)&lhs->field_0x8 & 0x3fffffff;
  local_4c = id;
  local_48 = rhs;
  if (uVar9 != 1) {
    lVar10 = 0;
    do {
      local_5c.rep_ = lhs[1].lits_[lVar10 + -3].rep_;
      bVar7 = *(byte *)((long)(this_00->assign_).assign_.ebo_.buf +
                       (ulong)(local_5c.rep_ & 0xfffffffc)) & 3;
      if (bVar7 != (byte)(((local_5c.rep_ & 2) == 0) + 1U)) {
        if (bVar7 == (byte)(2U - ((local_5c.rep_ & 2) == 0))) goto LAB_0019288e;
        uVar5 = 0x8000000000000000;
        if ((local_5c.rep_ & 2) == 0) {
          uVar5 = 0x4000000000000000;
        }
        *(ulong *)&this->occurs_[local_5c.rep_ >> 2].field_0x18 =
             *(ulong *)&this->occurs_[local_5c.rep_ >> 2].field_0x18 & 0x3fffffffffffffff | uVar5;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (local_58,&local_5c);
      }
      lVar10 = lVar10 + 1;
    } while (uVar9 - 1 != (int)lVar10);
  }
  uVar9 = *(uint *)&local_48->field_0x8 & 0x3fffffff;
  if (uVar9 != 1) {
    local_40 = 0x4000000000000000;
    lVar10 = 0;
    pCVar6 = local_48;
    do {
      local_5c.rep_ = pCVar6[1].lits_[lVar10 + -3].rep_;
      bVar7 = *(byte *)((long)(this_00->assign_).assign_.ebo_.buf +
                       (ulong)(local_5c.rep_ & 0xfffffffc)) & 3;
      if (bVar7 != (byte)(((local_5c.rep_ & 2) == 0) + 1U)) {
        uVar5 = *(ulong *)&this->occurs_[local_5c.rep_ >> 2].field_0x18;
        if ((2 - ((local_5c.rep_ & 2) == 0) & (uint)(uVar5 >> 0x3e)) == 0) {
          if (bVar7 == (byte)(2U - ((local_5c.rep_ & 2) == 0))) goto LAB_0019288e;
          uVar8 = 0x8000000000000000;
          if ((local_5c.rep_ & 2) == 0) {
            uVar8 = local_40;
          }
          *(ulong *)&this->occurs_[local_5c.rep_ >> 2].field_0x18 =
               uVar5 & 0x3fffffffffffffff | uVar8;
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (local_58,&local_5c);
          pCVar6 = local_48;
        }
      }
      lVar10 = lVar10 + 1;
    } while (uVar9 - 1 != (int)lVar10);
  }
  bVar3 = subsumed(this,local_58);
  if (bVar3) {
LAB_0019288e:
    uVar5 = (ulong)(this->resolvent_).ebo_.size;
    bVar3 = true;
    if (uVar5 != 0) {
      pLVar2 = (this->resolvent_).ebo_.buf;
      uVar8 = 0;
      do {
        puVar1 = &this->occurs_[pLVar2[uVar8].rep_ >> 2].field_0x18;
        *(ulong *)puVar1 = *(ulong *)puVar1 & 0x3fffffffffffffff;
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
  }
  else {
    size = (this->resolvent_).ebo_.size;
    if (size == 1) {
      puVar1 = &this->occurs_[((this->resolvent_).ebo_.buf)->rep_ >> 2].field_0x18;
      *(ulong *)puVar1 = *(ulong *)puVar1 & 0x3fffffffffffffff;
      local_38.data_ = 2;
      bVar3 = false;
      bVar4 = Solver::force(this_00,(Literal)((this->resolvent_).ebo_.buf)->rep_,0,&local_38,
                            0xffffffff);
      if (bVar4) {
        bVar3 = Solver::propagate(this_00);
        if (bVar3) {
          bVar3 = propagateFacts(this);
        }
        else {
          bVar3 = false;
        }
      }
    }
    else if (size == 0) {
      local_38.data_ = 2;
      bVar3 = Solver::force(this_00,(Literal)0x2,0,&local_38,0xffffffff);
    }
    else {
      pCVar6 = SatPreprocessor::Clause::newClause((this->resolvent_).ebo_.buf,size);
      (this->super_SatPreprocessor).clauses_.ebo_.buf[local_4c] = pCVar6;
      attach(this,local_4c,false);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool SatElite::addResolvent(uint32 id, const Clause& lhs, const Clause& rhs) {
	resolvent_.clear();
	Solver* s = ctx_->master();
	assert(lhs[0] == ~rhs[0]);
	uint32 i, end;
	Literal l;
	for (i = 1, end = lhs.size(); i != end; ++i) {
		l = lhs[i];
		if (!s->isFalse(l)) {
			if (s->isTrue(l)) goto unmark;
			occurs_[l.var()].mark(l.sign());
			resolvent_.push_back(l);
		}
	}
	for (i = 1, end = rhs.size(); i != end; ++i) {
		l = rhs[i];
		if (!s->isFalse(l) && !occurs_[l.var()].marked(l.sign())) {
			if (s->isTrue(l)) goto unmark;
			occurs_[l.var()].mark(l.sign());
			resolvent_.push_back(l);
		}
	}
	if (!subsumed(resolvent_))  {
		if (resolvent_.empty())   {
			return s->force(negLit(0));
		}
		if (resolvent_.size()==1) {
			occurs_[resolvent_[0].var()].unmark();
			return s->force(resolvent_[0]) && s->propagate() && propagateFacts();
		}
		setClause(id, resolvent_);
		attach(id, false);
		return true;
	}
unmark:
	if (!resolvent_.empty()) {
		unmarkAll(&resolvent_[0], resolvent_.size());
	}
	return true;
}